

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O3

PropertyExprSyntax * __thiscall slang::parsing::Parser::parseCasePropertyExpr(Parser *this)

{
  Token closeParen;
  bool bVar1;
  TokenKind TVar2;
  int iVar3;
  SourceLocation SVar4;
  ExpressionSyntax *pEVar5;
  DefaultPropertyCaseItemSyntax *pDVar6;
  PropertyExprSyntax *pPVar7;
  undefined4 extraout_var;
  StandardPropertyCaseItemSyntax *pSVar8;
  Diagnostic *pDVar9;
  undefined4 extraout_var_00;
  CasePropertyExprSyntax *pCVar10;
  ulong uVar11;
  Token openParen;
  Token TVar12;
  Token endcase;
  string_view arg;
  Token defaultKeyword;
  string_view arg_00;
  Token keyword;
  SmallVector<slang::syntax::PropertyCaseItemSyntax_*,_5UL> itemBuffer;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> buffer;
  Token local_238;
  SourceLocation local_228;
  SyntaxFactory *local_220;
  Token local_218;
  ulong local_208;
  Token local_200;
  ExpressionSyntax *local_1f0;
  Info *local_1e8;
  undefined8 local_1e0;
  Info *local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  Token local_1c0;
  SyntaxNode *local_1b0;
  SyntaxNode *pSStack_1a8;
  pointer local_198;
  Token local_188;
  undefined8 local_178;
  Info *pIStack_170;
  Token local_168;
  Token local_158;
  SmallVectorBase<slang::syntax::PropertyCaseItemSyntax_*> local_148 [2];
  undefined1 local_108 [24];
  undefined1 auStack_f0 [192];
  
  local_200 = ParserBase::consume(&this->super_ParserBase);
  TVar12 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  local_1e8 = TVar12.info;
  local_1e0 = TVar12._0_8_;
  local_228 = (SourceLocation)0x0;
  local_1f0 = parseExpressionOrDist(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0);
  TVar12 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
  local_148[0].data_ = (pointer)local_148[0].firstElement;
  local_148[0].len = 0;
  local_148[0].cap = 5;
  local_220 = &this->factory;
  local_208 = 0;
  do {
    while( true ) {
      local_1d8 = TVar12.info;
      local_1d0 = TVar12._0_8_;
      TVar12 = ParserBase::peek(&this->super_ParserBase);
      TVar2 = TVar12.kind;
      uVar11 = (ulong)TVar2;
      if (TVar2 != DefaultKeyword) break;
      if (((ulong)local_228 & 0xfffffff) != 0 && (local_208 & 1) == 0) {
        local_108._0_16_ = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
        SVar4 = Token::location((Token *)local_108);
        pDVar9 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x7f0005,SVar4);
        arg._M_str = "case";
        arg._M_len = 4;
        pDVar9 = Diagnostic::operator<<(pDVar9,arg);
        local_208 = CONCAT71((int7)(uVar11 >> 8),1);
        Diagnostic::addNote(pDVar9,(DiagCode)0xa0001,local_228);
      }
      local_108._0_16_ = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
      local_228 = Token::location((Token *)local_108);
      TVar12 = ParserBase::consume(&this->super_ParserBase);
      defaultKeyword.info = TVar12.info;
      local_1c8 = TVar12._0_8_;
      TVar12 = ParserBase::consumeIf(&this->super_ParserBase,Colon);
      pPVar7 = parsePropertyExpr(this,0);
      local_158 = ParserBase::expect(&this->super_ParserBase,Semicolon);
      defaultKeyword.kind = (undefined2)local_1c8;
      defaultKeyword._2_1_ = local_1c8._2_1_;
      defaultKeyword.numFlags.raw = local_1c8._3_1_;
      defaultKeyword.rawLen = local_1c8._4_4_;
      pDVar6 = slang::syntax::SyntaxFactory::defaultPropertyCaseItem
                         (local_220,defaultKeyword,TVar12,pPVar7,local_158);
      local_108._0_8_ = pDVar6;
      SmallVectorBase<slang::syntax::PropertyCaseItemSyntax*>::
      emplace_back<slang::syntax::PropertyCaseItemSyntax*>
                ((SmallVectorBase<slang::syntax::PropertyCaseItemSyntax*> *)local_148,
                 (PropertyCaseItemSyntax **)local_108);
      TVar12.info = local_1d8;
      TVar12.kind = (undefined2)local_1d0;
      TVar12._2_1_ = local_1d0._2_1_;
      TVar12.numFlags.raw = local_1d0._3_1_;
      TVar12.rawLen = local_1d0._4_4_;
    }
    bVar1 = slang::syntax::SyntaxFacts::isPossibleExpression(TVar2);
    if (!bVar1) {
      if (local_148[0].len == 0) {
        SVar4 = Token::location(&local_200);
        pDVar9 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x50005,SVar4);
        arg_00._M_str = "case";
        arg_00._M_len = 4;
        Diagnostic::operator<<(pDVar9,arg_00);
      }
      endcase = ParserBase::expect(&this->super_ParserBase,EndCaseKeyword);
      TVar12 = local_200;
      local_178 = local_1d0;
      pIStack_170 = local_1d8;
      iVar3 = SmallVectorBase<slang::syntax::PropertyCaseItemSyntax_*>::copy
                        (local_148,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,
                         (EVP_PKEY_CTX *)endcase.info);
      auStack_f0._16_8_ = CONCAT44(extraout_var_00,iVar3);
      local_108._8_4_ = 1;
      local_108._16_8_ = (SyntaxNode *)0x0;
      auStack_f0._0_8_ = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)0x0;
      local_108._0_8_ = &PTR_getChild_00699260;
      closeParen.info = pIStack_170;
      closeParen.kind = (undefined2)local_178;
      closeParen._2_1_ = local_178._2_1_;
      closeParen.numFlags.raw = local_178._3_1_;
      closeParen.rawLen = local_178._4_4_;
      openParen.info = local_1e8;
      openParen.kind = (undefined2)local_1e0;
      openParen._2_1_ = local_1e0._2_1_;
      openParen.numFlags.raw = local_1e0._3_1_;
      openParen.rawLen = local_1e0._4_4_;
      local_188 = endcase;
      pCVar10 = slang::syntax::SyntaxFactory::casePropertyExpr
                          (local_220,TVar12,openParen,local_1f0,closeParen,
                           (SyntaxList<slang::syntax::PropertyCaseItemSyntax> *)local_108,endcase);
      if (local_148[0].data_ != (pointer)local_148[0].firstElement) {
        operator_delete(local_148[0].data_);
      }
      return &pCVar10->super_PropertyExprSyntax;
    }
    Token::Token(&local_218);
    local_108._8_8_ = 0;
    local_108._0_8_ = auStack_f0;
    local_108._16_8_ = (SyntaxNode *)0x8;
    local_238 = ParserBase::peek(&this->super_ParserBase);
    bVar1 = slang::syntax::SyntaxFacts::isEndOfCaseItem(local_238.kind);
    if (bVar1) {
      bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
      if (!bVar1) {
        SVar4 = Token::location(&local_238);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x10001,SVar4);
      }
      local_218 = ParserBase::expect(&this->super_ParserBase,Colon);
    }
    else {
      bVar1 = slang::syntax::SyntaxFacts::isPossibleExpressionOrComma(local_238.kind);
      TVar12 = local_238;
      if (bVar1) {
        do {
          local_238 = TVar12;
          pEVar5 = parseSubExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x80,
                                      0);
          local_1c0._0_8_ = pEVar5;
          local_1b0 = (SyntaxNode *)CONCAT71(local_1b0._1_7_,1);
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_108,
                     (TokenOrSyntax *)&local_1c0);
          TVar12 = ParserBase::peek(&this->super_ParserBase);
          TVar2 = TVar12.kind;
          bVar1 = slang::syntax::SyntaxFacts::isEndOfCaseItem(TVar2);
          if (TVar2 == EndOfFile || bVar1) break;
          if (TVar2 != Comma) {
            ParserBase::expect(&this->super_ParserBase,Comma);
            do {
              bVar1 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfCaseItem>
                                (&this->super_ParserBase,(DiagCode)0x10001,false);
              if (!bVar1) {
                local_218 = ParserBase::expect(&this->super_ParserBase,Colon);
                goto LAB_00425ca7;
              }
              bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
            } while (!bVar1);
          }
          local_1c0 = ParserBase::expect(&this->super_ParserBase,Comma);
          local_1b0 = (SyntaxNode *)((ulong)local_1b0 & 0xffffffffffffff00);
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_108,
                     (TokenOrSyntax *)&local_1c0);
          TVar12 = ParserBase::peek(&this->super_ParserBase);
          TVar2 = TVar12.kind;
          bVar1 = slang::syntax::SyntaxFacts::isEndOfCaseItem(TVar2);
          if (TVar2 == EndOfFile || bVar1) {
            ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
            break;
          }
        } while (((local_238.kind != TVar2) || (local_238.info != TVar12.info)) ||
                (bVar1 = ParserBase::
                         skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfCaseItem>
                                   (&this->super_ParserBase,(DiagCode)0x10001,true), bVar1));
        local_218 = ParserBase::expect(&this->super_ParserBase,Colon);
      }
      else {
        ParserBase::reportMissingList
                  (&this->super_ParserBase,local_238,Colon,&local_218,(DiagCode)0x10001);
      }
    }
LAB_00425ca7:
    pPVar7 = parsePropertyExpr(this,0);
    TVar12 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    iVar3 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                      ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_108,
                       (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)TVar12.info);
    local_198 = (pointer)CONCAT44(extraout_var,iVar3);
    local_1c0.info._0_4_ = 3;
    local_1b0 = (SyntaxNode *)0x0;
    pSStack_1a8 = (SyntaxNode *)0x0;
    local_1c0._0_8_ = &PTR_getChild_006993c8;
    local_168 = TVar12;
    pSVar8 = slang::syntax::SyntaxFactory::standardPropertyCaseItem
                       (local_220,(SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)&local_1c0
                        ,local_218,pPVar7,TVar12);
    local_238._0_8_ = pSVar8;
    SmallVectorBase<slang::syntax::PropertyCaseItemSyntax*>::
    emplace_back<slang::syntax::PropertyCaseItemSyntax*>
              ((SmallVectorBase<slang::syntax::PropertyCaseItemSyntax*> *)local_148,
               (PropertyCaseItemSyntax **)&local_238);
    TVar12.info = local_1d8;
    TVar12.kind = (undefined2)local_1d0;
    TVar12._2_1_ = local_1d0._2_1_;
    TVar12.numFlags.raw = local_1d0._3_1_;
    TVar12.rawLen = local_1d0._4_4_;
    if ((pointer)local_108._0_8_ != (pointer)auStack_f0) {
      operator_delete((void *)local_108._0_8_);
      TVar12.info = local_1d8;
      TVar12.kind = (undefined2)local_1d0;
      TVar12._2_1_ = local_1d0._2_1_;
      TVar12.numFlags.raw = local_1d0._3_1_;
      TVar12.rawLen = local_1d0._4_4_;
    }
  } while( true );
}

Assistant:

PropertyExprSyntax& Parser::parseCasePropertyExpr() {
    auto keyword = consume();
    auto openParen = expect(TokenKind::OpenParenthesis);
    auto& condition = parseExpressionOrDist();
    auto closeParen = expect(TokenKind::CloseParenthesis);

    SmallVector<PropertyCaseItemSyntax*> itemBuffer;
    SourceLocation lastDefault;
    bool errored = false;

    while (true) {
        auto kind = peek().kind;
        if (kind == TokenKind::DefaultKeyword) {
            if (lastDefault && !errored) {
                auto& diag = addDiag(diag::MultipleDefaultCases, peek().location()) << "case"sv;
                diag.addNote(diag::NotePreviousDefinition, lastDefault);
                errored = true;
            }

            lastDefault = peek().location();

            auto def = consume();
            auto colon = consumeIf(TokenKind::Colon);
            auto& expr = parsePropertyExpr(0);
            auto semi = expect(TokenKind::Semicolon);
            itemBuffer.push_back(&factory.defaultPropertyCaseItem(def, colon, expr, semi));
        }
        else if (isPossibleExpression(kind)) {
            Token colon;
            SmallVector<TokenOrSyntax, 8> buffer;
            parseList<isPossibleExpressionOrComma, isEndOfCaseItem>(
                buffer, TokenKind::Colon, TokenKind::Comma, colon, RequireItems::True,
                diag::ExpectedExpression, [this] { return &parseExpressionOrDist(); });

            auto& expr = parsePropertyExpr(0);
            auto semi = expect(TokenKind::Semicolon);
            itemBuffer.push_back(
                &factory.standardPropertyCaseItem(buffer.copy(alloc), colon, expr, semi));
        }
        else {
            break;
        }
    }

    if (itemBuffer.empty())
        addDiag(diag::CaseStatementEmpty, keyword.location()) << "case"sv;

    auto endcase = expect(TokenKind::EndCaseKeyword);
    return factory.casePropertyExpr(keyword, openParen, condition, closeParen,
                                    itemBuffer.copy(alloc), endcase);
}